

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_connectionErrorNoMapVariables_Test::Parser_connectionErrorNoMapVariables_Test
          (Parser_connectionErrorNoMapVariables_Test *this)

{
  Parser_connectionErrorNoMapVariables_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Parser_connectionErrorNoMapVariables_Test_00185c28;
  return;
}

Assistant:

TEST(Parser, connectionErrorNoMapVariables)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"componentA\">\n"
        "    <variable name=\"variable1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_2=\"componentA\" component_1=\"componentA\" component_3=\"componentA\"/>\n"
        "  <connection component_2=\"componentA\" component_1=\"componentA\"/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Connection in model '' has an invalid connection attribute 'component_3'.",
        "Connection in model '' has a connection to itself, the at fault component is 'componentA'.",
        "Connection in model '' does not contain any 'map_variables' elements and will be disregarded.",
        "Connection in model '' has a connection to itself, the at fault component is 'componentA'.",
        "Connection in model '' does not contain any 'map_variables' elements and will be disregarded.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}